

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_proto_internal.h
# Opt level: O0

int encode_header(tnt_iheader *hdr,uint32_t code,uint64_t sync)

{
  char *pcVar1;
  char *h;
  uint64_t sync_local;
  uint32_t code_local;
  tnt_iheader *hdr_local;
  
  memset(hdr,0,0x28);
  pcVar1 = mp_encode_map(hdr->header,2);
  pcVar1 = mp_encode_uint(pcVar1,0);
  pcVar1 = mp_encode_uint(pcVar1,(ulong)code);
  pcVar1 = mp_encode_uint(pcVar1,1);
  pcVar1 = mp_encode_uint(pcVar1,sync);
  hdr->end = pcVar1;
  return 0;
}

Assistant:

static inline int
encode_header(struct tnt_iheader *hdr, uint32_t code, uint64_t sync)
{
	memset(hdr, 0, sizeof(struct tnt_iheader));
	char *h = mp_encode_map(hdr->header, 2);
	h = mp_encode_uint(h, TNT_CODE);
	h = mp_encode_uint(h, code);
	h = mp_encode_uint(h, TNT_SYNC);
	h = mp_encode_uint(h, sync);
	hdr->end = h;
	return 0;
}